

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O3

bool SetPropertyCommand::HandleSourceFileDirectoryScopes
               (cmExecutionStatus *status,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *source_file_directories,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *source_file_target_directories,
               vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *directory_makefiles)

{
  pointer *pppcVar1;
  cmMakefile *this;
  string *psVar2;
  long *plVar3;
  cmMakefile *pcVar4;
  pointer pbVar5;
  iterator iVar6;
  string *in_base;
  cmGlobalGenerator *pcVar7;
  cmMakefile *pcVar8;
  cmTarget *this_00;
  string *psVar9;
  bool bVar10;
  __hash_code __code;
  pointer name;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string absolute_dir_path;
  cmMakefile *dir_mf;
  cmMakefile *current_dir_mf;
  unordered_set<cmMakefile_*,_std::hash<cmMakefile_*>,_std::equal_to<cmMakefile_*>,_std::allocator<cmMakefile_*>_>
  directory_makefiles_set;
  undefined1 local_f0 [32];
  string local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b0;
  cmMakefile *local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a0;
  string *local_98;
  cmMakefile *local_90;
  string local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_68._M_allocated_capacity = (size_type)&uStack_38;
  local_68._8_8_ = 1;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0x3f800000;
  local_40 = 0;
  uStack_38 = 0;
  this = status->Makefile;
  psVar9 = (source_file_directories->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (source_file_directories->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_b0 = source_file_target_directories;
  local_a0 = source_file_directories;
  local_90 = this;
  if (psVar9 != psVar2) {
    local_98 = (string *)&status->Error;
    do {
      in_base = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
      cmsys::SystemTools::CollapseFullPath((string *)local_f0,psVar9,in_base);
      pcVar7 = cmMakefile::GetGlobalGenerator(status->Makefile);
      pcVar8 = cmGlobalGenerator::FindMakefile(pcVar7,(string *)local_f0);
      local_a8 = pcVar8;
      if (pcVar8 == (cmMakefile *)0x0) {
        local_d0.field_2._8_8_ = (psVar9->_M_dataplus)._M_p;
        local_d0.field_2._M_allocated_capacity = psVar9->_M_string_length;
        local_d0._M_dataplus._M_p = (pointer)0x1d;
        local_d0._M_string_length = 0x77bae8;
        views._M_len = 2;
        views._M_array = (iterator)&local_d0;
        cmCatViews_abi_cxx11_(&local_88,views);
        std::__cxx11::string::_M_assign(local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        plVar3 = *(long **)(local_68._M_allocated_capacity +
                           ((ulong)pcVar8 % (ulong)local_68._8_8_) * 8);
        if (plVar3 != (long *)0x0) {
          plVar3 = (long *)*plVar3;
          pcVar4 = (cmMakefile *)plVar3[1];
          do {
            if (pcVar8 == pcVar4) goto LAB_003bcc07;
            plVar3 = (long *)*plVar3;
          } while ((plVar3 != (long *)0x0) &&
                  (pcVar4 = (cmMakefile *)plVar3[1],
                  (ulong)pcVar4 % (ulong)local_68._8_8_ == (ulong)pcVar8 % (ulong)local_68._8_8_));
        }
        iVar6._M_current =
             (directory_makefiles->super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (directory_makefiles->super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<cmMakefile*,std::allocator<cmMakefile*>>::_M_realloc_insert<cmMakefile*const&>
                    ((vector<cmMakefile*,std::allocator<cmMakefile*>> *)directory_makefiles,iVar6,
                     &local_a8);
        }
        else {
          *iVar6._M_current = pcVar8;
          pppcVar1 = &(directory_makefiles->
                      super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppcVar1 = *pppcVar1 + 1;
        }
        local_d0._M_dataplus._M_p = (pointer)&local_68;
        std::
        _Hashtable<cmMakefile*,cmMakefile*,std::allocator<cmMakefile*>,std::__detail::_Identity,std::equal_to<cmMakefile*>,std::hash<cmMakefile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<cmMakefile*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<cmMakefile*,false>>>>
                  ((_Hashtable<cmMakefile*,cmMakefile*,std::allocator<cmMakefile*>,std::__detail::_Identity,std::equal_to<cmMakefile*>,std::hash<cmMakefile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_d0._M_dataplus._M_p,&local_a8,&local_d0);
      }
LAB_003bcc07:
      if ((cmMakefile *)local_f0._0_8_ != (cmMakefile *)(local_f0 + 0x10)) {
        operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
      }
      if (pcVar8 == (cmMakefile *)0x0) goto LAB_003bce17;
      psVar9 = psVar9 + 1;
    } while (psVar9 != psVar2);
  }
  name = (local_b0->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (local_b0->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (name != pbVar5) {
    do {
      this_00 = cmMakefile::FindTargetToUse(this,name,false);
      if (this_00 == (cmTarget *)0x0) {
        local_d0.field_2._8_8_ = (name->_M_dataplus)._M_p;
        local_d0.field_2._M_allocated_capacity = name->_M_string_length;
        local_d0._M_dataplus._M_p = (pointer)0x2f;
        local_d0._M_string_length = 0x77bb06;
        views_00._M_len = 2;
        views_00._M_array = (iterator)&local_d0;
        cmCatViews_abi_cxx11_((string *)local_f0,views_00);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        if ((cmMakefile *)local_f0._0_8_ != (cmMakefile *)(local_f0 + 0x10)) {
          operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
        }
LAB_003bce17:
        bVar10 = false;
        goto LAB_003bce19;
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"BINARY_DIR","");
      psVar9 = (string *)cmTarget::GetProperty(this_00,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      pcVar7 = cmMakefile::GetGlobalGenerator(status->Makefile);
      if (psVar9 == (string *)0x0) {
        psVar9 = &cmValue::Empty_abi_cxx11_;
      }
      local_f0._0_8_ = cmGlobalGenerator::FindMakefile(pcVar7,psVar9);
      plVar3 = *(long **)(local_68._M_allocated_capacity +
                         ((ulong)local_f0._0_8_ % (ulong)local_68._8_8_) * 8);
      if (plVar3 != (long *)0x0) {
        plVar3 = (long *)*plVar3;
        pcVar8 = (cmMakefile *)plVar3[1];
        do {
          if ((cmMakefile *)local_f0._0_8_ == pcVar8) goto LAB_003bcd64;
          plVar3 = (long *)*plVar3;
        } while ((plVar3 != (long *)0x0) &&
                (pcVar8 = (cmMakefile *)plVar3[1],
                (ulong)pcVar8 % (ulong)local_68._8_8_ ==
                (ulong)local_f0._0_8_ % (ulong)local_68._8_8_));
      }
      iVar6._M_current =
           (directory_makefiles->super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (directory_makefiles->super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmMakefile*,std::allocator<cmMakefile*>>::_M_realloc_insert<cmMakefile*const&>
                  ((vector<cmMakefile*,std::allocator<cmMakefile*>> *)directory_makefiles,iVar6,
                   (cmMakefile **)local_f0);
      }
      else {
        *iVar6._M_current = (cmMakefile *)local_f0._0_8_;
        pppcVar1 = &(directory_makefiles->
                    super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
      local_d0._M_dataplus._M_p = (pointer)&local_68;
      std::
      _Hashtable<cmMakefile*,cmMakefile*,std::allocator<cmMakefile*>,std::__detail::_Identity,std::equal_to<cmMakefile*>,std::hash<cmMakefile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<cmMakefile*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<cmMakefile*,false>>>>
                ((_Hashtable<cmMakefile*,cmMakefile*,std::allocator<cmMakefile*>,std::__detail::_Identity,std::equal_to<cmMakefile*>,std::hash<cmMakefile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_d0._M_dataplus._M_p,local_f0,&local_d0);
LAB_003bcd64:
      name = name + 1;
    } while (name != pbVar5);
  }
  bVar10 = true;
  if (((local_a0->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start ==
       (local_a0->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish) &&
     ((local_b0->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (local_b0->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar6._M_current =
         (directory_makefiles->super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (directory_makefiles->super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<cmMakefile*,std::allocator<cmMakefile*>>::_M_realloc_insert<cmMakefile*const&>
                ((vector<cmMakefile*,std::allocator<cmMakefile*>> *)directory_makefiles,iVar6,
                 &local_90);
    }
    else {
      *iVar6._M_current = this;
      pppcVar1 = &(directory_makefiles->
                  super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppcVar1 = *pppcVar1 + 1;
    }
  }
LAB_003bce19:
  std::
  _Hashtable<cmMakefile_*,_cmMakefile_*,_std::allocator<cmMakefile_*>,_std::__detail::_Identity,_std::equal_to<cmMakefile_*>,_std::hash<cmMakefile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<cmMakefile_*,_cmMakefile_*,_std::allocator<cmMakefile_*>,_std::__detail::_Identity,_std::equal_to<cmMakefile_*>,_std::hash<cmMakefile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_68);
  return bVar10;
}

Assistant:

bool HandleSourceFileDirectoryScopes(
  cmExecutionStatus& status, std::vector<std::string>& source_file_directories,
  std::vector<std::string>& source_file_target_directories,
  std::vector<cmMakefile*>& directory_makefiles)
{
  std::unordered_set<cmMakefile*> directory_makefiles_set;

  cmMakefile* current_dir_mf = &status.GetMakefile();
  if (!source_file_directories.empty()) {
    for (const std::string& dir_path : source_file_directories) {
      const std::string absolute_dir_path = cmSystemTools::CollapseFullPath(
        dir_path, current_dir_mf->GetCurrentSourceDirectory());
      cmMakefile* dir_mf =
        status.GetMakefile().GetGlobalGenerator()->FindMakefile(
          absolute_dir_path);
      if (!dir_mf) {
        status.SetError(cmStrCat("given non-existent DIRECTORY ", dir_path));
        return false;
      }
      if (directory_makefiles_set.find(dir_mf) ==
          directory_makefiles_set.end()) {
        directory_makefiles.push_back(dir_mf);
        directory_makefiles_set.insert(dir_mf);
      }
    }
  }

  if (!source_file_target_directories.empty()) {
    for (const std::string& target_name : source_file_target_directories) {
      cmTarget* target = current_dir_mf->FindTargetToUse(target_name);
      if (!target) {
        status.SetError(cmStrCat(
          "given non-existent target for TARGET_DIRECTORY ", target_name));
        return false;
      }
      cmValue target_source_dir = target->GetProperty("BINARY_DIR");
      cmMakefile* target_dir_mf =
        status.GetMakefile().GetGlobalGenerator()->FindMakefile(
          *target_source_dir);

      if (directory_makefiles_set.find(target_dir_mf) ==
          directory_makefiles_set.end()) {
        directory_makefiles.push_back(target_dir_mf);
        directory_makefiles_set.insert(target_dir_mf);
      }
    }
  }

  if (source_file_directories.empty() &&
      source_file_target_directories.empty()) {
    directory_makefiles.push_back(current_dir_mf);
  }
  return true;
}